

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O1

void Assimp::FBX::ResolveVertexDataArray<aiVector2t<float>>
               (vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *data_out,
               Scope *source,string *MappingInformationType,string *ReferenceInformationType,
               char *dataElementName,char *indexDataElementName,size_t vertex_count,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mapping_counts,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mapping_offsets,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mappings)

{
  pointer pcVar1;
  uint uVar2;
  undefined8 uVar3;
  _Alloc_hider _Var4;
  pointer paVar5;
  bool bVar6;
  Scope *pSVar7;
  char *pcVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  Element *pEVar12;
  long lVar13;
  pointer piVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> tempData_1;
  vector<int,_std::allocator<int>_> uvIndices;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_229;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> local_228;
  vector<int,_std::allocator<int>_> local_208;
  Scope *local_1e8;
  char *local_1e0;
  char *local_1d8;
  string *local_1d0;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1e0 = dataElementName;
  iVar10 = std::__cxx11::string::compare((char *)ReferenceInformationType);
  local_1d0 = ReferenceInformationType;
  iVar11 = std::__cxx11::string::compare((char *)ReferenceInformationType);
  local_1e8 = source;
  local_1d8 = indexDataElementName;
  if (iVar11 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,indexDataElementName,&local_229);
    bVar9 = HasElement(source,&local_1c8);
    bVar9 = !bVar9;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar9 = false;
  }
  bVar6 = (bool)(iVar10 == 0 | bVar9);
  iVar10 = std::__cxx11::string::compare((char *)MappingInformationType);
  pcVar8 = local_1e0;
  if ((bVar6) && (iVar10 == 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,local_1e0,(allocator<char> *)&local_258);
    pSVar7 = local_1e8;
    bVar9 = HasElement(local_1e8,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (!bVar9) {
      return;
    }
    local_258._M_dataplus._M_p = (pointer)0x0;
    local_258._M_string_length = 0;
    local_258.field_2._M_allocated_capacity = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,pcVar8,(allocator<char> *)&local_228);
    pEVar12 = GetRequiredElement(pSVar7,(string *)local_1a8,(Element *)0x0);
    ParseVectorDataArray
              ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)&local_258,pEVar12)
    ;
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::resize
              (data_out,vertex_count);
    _Var4._M_p = local_258._M_dataplus._M_p;
    uVar3 = local_258.field_2._M_allocated_capacity;
    if (local_258._M_string_length - (long)local_258._M_dataplus._M_p != 0) {
      lVar13 = (long)(local_258._M_string_length - (long)local_258._M_dataplus._M_p) >> 3;
      lVar15 = 0;
      do {
        uVar2 = (mapping_offsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start[lVar15];
        uVar16 = (ulong)uVar2;
        uVar17 = (mapping_counts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar15] + uVar2;
        if (uVar2 < uVar17) {
          do {
            (data_out->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start
            [(mappings->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar16]] =
                 *(aiVector2t<float> *)(local_258._M_dataplus._M_p + lVar15 * 8);
            uVar16 = uVar16 + 1;
          } while (uVar17 != uVar16);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != lVar13 + (ulong)(lVar13 == 0));
    }
  }
  else {
    iVar10 = std::__cxx11::string::compare((char *)MappingInformationType);
    if ((iVar11 != 0 || bVar9) || (iVar10 != 0)) {
      iVar10 = std::__cxx11::string::compare((char *)MappingInformationType);
      pcVar8 = local_1e0;
      pSVar7 = local_1e8;
      if (bVar6 && iVar10 == 0) {
        local_258._M_dataplus._M_p = (pointer)0x0;
        local_258._M_string_length = 0;
        local_258.field_2._M_allocated_capacity = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1a8,local_1e0,(allocator<char> *)&local_228);
        pEVar12 = GetRequiredElement(pSVar7,(string *)local_1a8,(Element *)0x0);
        ParseVectorDataArray
                  ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)&local_258,
                   pEVar12);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if ((long)(local_258._M_string_length - (long)local_258._M_dataplus._M_p) >> 3 ==
            vertex_count) {
          _Var4._M_p = (pointer)(data_out->
                                super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                                )._M_impl.super__Vector_impl_data._M_start;
          paVar5 = (data_out->
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          uVar3 = (data_out->
                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
          (data_out->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_258._M_dataplus._M_p;
          (data_out->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_finish = (pointer)local_258._M_string_length;
          (data_out->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)local_258.field_2._M_allocated_capacity;
          local_258._M_dataplus._M_p = _Var4._M_p;
          local_258._M_string_length = (size_type)paVar5;
          local_258.field_2._M_allocated_capacity = uVar3;
        }
        else {
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[56]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1a8,
                     (char (*) [56])"length of input data unexpected for ByPolygon mapping: ");
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", expected ",0xb)
          ;
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          LogFunctions<Assimp::FBXImporter>::LogError((format *)local_1a8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          _Var4._M_p = local_258._M_dataplus._M_p;
          uVar3 = local_258.field_2._M_allocated_capacity;
        }
        goto joined_r0x0060f6f5;
      }
      iVar10 = std::__cxx11::string::compare((char *)MappingInformationType);
      if ((iVar11 != 0 || bVar9) || iVar10 != 0) {
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[60]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [60])"ignoring vertex data channel, access type not implemented: ");
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(MappingInformationType->_M_dataplus)._M_p,
                   MappingInformationType->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(local_1d0->_M_dataplus)._M_p,local_1d0->_M_string_length);
        LogFunctions<Assimp::FBXImporter>::LogError((format *)local_1a8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        return;
      }
      local_228.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_228.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_228.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,pcVar8,(allocator<char> *)&local_258);
      pEVar12 = GetRequiredElement(pSVar7,(string *)local_1a8,(Element *)0x0);
      pcVar8 = local_1d8;
      ParseVectorDataArray(&local_228,pEVar12);
      pcVar1 = local_1a8 + 0x10;
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::resize
                (data_out,vertex_count);
      local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,pcVar8,(allocator<char> *)&local_258);
      pEVar12 = GetRequiredElement(pSVar7,(string *)local_1a8,(Element *)0x0);
      ParseVectorDataArray(&local_208,pEVar12);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2 == vertex_count) {
        if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start !=
            local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish) {
          uVar16 = 0;
          piVar14 = local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            uVar18 = (ulong)*piVar14;
            if (uVar18 == 0xffffffffffffffff) {
              paVar5 = (data_out->
                       super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_start + uVar16;
              paVar5->x = 0.0;
              paVar5->y = 0.0;
            }
            else {
              if ((ulong)((long)local_228.
                                super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_228.
                                super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar18) {
                local_1a8._0_8_ = pcVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1a8,"index out of range","");
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_258,pcVar8,&local_259);
                pEVar12 = GetRequiredElement(pSVar7,&local_258,(Element *)0x0);
                Util::DOMError((string *)local_1a8,pEVar12);
              }
              (data_out->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>)
              ._M_impl.super__Vector_impl_data._M_start[uVar16] =
                   local_228.
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar18];
            }
            uVar16 = (ulong)((int)uVar16 + 1);
            piVar14 = piVar14 + 1;
          } while (piVar14 !=
                   local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
      }
      else {
        LogFunctions<Assimp::FBXImporter>::LogError((char *)0x60faa9);
      }
    }
    else {
      local_228.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_228.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_228.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,local_1e0,(allocator<char> *)&local_258);
      pSVar7 = local_1e8;
      pEVar12 = GetRequiredElement(local_1e8,(string *)local_1a8,(Element *)0x0);
      pcVar8 = local_1d8;
      ParseVectorDataArray(&local_228,pEVar12);
      pcVar1 = local_1a8 + 0x10;
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::resize
                (data_out,vertex_count);
      local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,pcVar8,(allocator<char> *)&local_258);
      pEVar12 = GetRequiredElement(pSVar7,(string *)local_1a8,(Element *)0x0);
      ParseVectorDataArray(&local_208,pEVar12);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        lVar13 = (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
        lVar15 = 0;
        do {
          uVar2 = (mapping_offsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                  ._M_impl.super__Vector_impl_data._M_start[lVar15];
          uVar16 = (ulong)uVar2;
          uVar17 = (mapping_counts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                   ._M_impl.super__Vector_impl_data._M_start[lVar15] + uVar2;
          if (uVar2 < uVar17) {
            do {
              if ((ulong)((long)local_228.
                                super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_228.
                                super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) <=
                  (ulong)(long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar15]) {
                local_1a8._0_8_ = pcVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1a8,"index out of range","");
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_258,pcVar8,&local_259);
                pEVar12 = GetRequiredElement(pSVar7,&local_258,(Element *)0x0);
                Util::DOMError((string *)local_1a8,pEVar12);
              }
              (data_out->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>)
              ._M_impl.super__Vector_impl_data._M_start
              [(mappings->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar16]] =
                   local_228.
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start
                   [local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar15]];
              uVar16 = uVar16 + 1;
            } while (uVar17 != uVar16);
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != lVar13 + (ulong)(lVar13 == 0));
      }
    }
    _Var4._M_p = (pointer)local_228.
                          super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = local_228.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
      _Var4._M_p = (pointer)local_228.
                            super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = local_228.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
  }
joined_r0x0060f6f5:
  if ((pointer)_Var4._M_p != (pointer)0x0) {
    operator_delete(_Var4._M_p,uVar3 - (long)_Var4._M_p);
  }
  return;
}

Assistant:

void ResolveVertexDataArray(std::vector<T>& data_out, const Scope& source,
    const std::string& MappingInformationType,
    const std::string& ReferenceInformationType,
    const char* dataElementName,
    const char* indexDataElementName,
    size_t vertex_count,
    const std::vector<unsigned int>& mapping_counts,
    const std::vector<unsigned int>& mapping_offsets,
    const std::vector<unsigned int>& mappings)
{
    bool isDirect = ReferenceInformationType == "Direct";
    bool isIndexToDirect = ReferenceInformationType == "IndexToDirect";

    // fall-back to direct data if there is no index data element
    if ( isIndexToDirect && !HasElement( source, indexDataElementName ) ) {
        isDirect = true;
        isIndexToDirect = false;
    }

    // handle permutations of Mapping and Reference type - it would be nice to
    // deal with this more elegantly and with less redundancy, but right
    // now it seems unavoidable.
    if (MappingInformationType == "ByVertice" && isDirect) {
        if (!HasElement(source, dataElementName)) {
            return;
        }
        std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);
		for (size_t i = 0, e = tempData.size(); i < e; ++i) {

            const unsigned int istart = mapping_offsets[i], iend = istart + mapping_counts[i];
            for (unsigned int j = istart; j < iend; ++j) {
				data_out[mappings[j]] = tempData[i];
            }
        }
    }
    else if (MappingInformationType == "ByVertice" && isIndexToDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);

        std::vector<int> uvIndices;
        ParseVectorDataArray(uvIndices,GetRequiredElement(source,indexDataElementName));
        for (size_t i = 0, e = uvIndices.size(); i < e; ++i) {

            const unsigned int istart = mapping_offsets[i], iend = istart + mapping_counts[i];
            for (unsigned int j = istart; j < iend; ++j) {
				if (static_cast<size_t>(uvIndices[i]) >= tempData.size()) {
                    DOMError("index out of range",&GetRequiredElement(source,indexDataElementName));
                }
				data_out[mappings[j]] = tempData[uvIndices[i]];
            }
        }
    }
    else if (MappingInformationType == "ByPolygonVertex" && isDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

		if (tempData.size() != vertex_count) {
            FBXImporter::LogError(Formatter::format("length of input data unexpected for ByPolygon mapping: ")
				<< tempData.size() << ", expected " << vertex_count
            );
            return;
        }

		data_out.swap(tempData);
    }
    else if (MappingInformationType == "ByPolygonVertex" && isIndexToDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);

        std::vector<int> uvIndices;
        ParseVectorDataArray(uvIndices,GetRequiredElement(source,indexDataElementName));

        if (uvIndices.size() != vertex_count) {
            FBXImporter::LogError("length of input data unexpected for ByPolygonVertex mapping");
            return;
        }

        const T empty;
        unsigned int next = 0;
        for(int i : uvIndices) {
            if ( -1 == i ) {
                data_out[ next++ ] = empty;
                continue;
            }
            if (static_cast<size_t>(i) >= tempData.size()) {
                DOMError("index out of range",&GetRequiredElement(source,indexDataElementName));
            }

			data_out[next++] = tempData[i];
        }
    }
    else {
        FBXImporter::LogError(Formatter::format("ignoring vertex data channel, access type not implemented: ")
            << MappingInformationType << "," << ReferenceInformationType);
    }
}